

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

internalJSONNode * internalJSONNode::newInternal(json_string *unparsed)

{
  internalJSONNode *this;
  
  this = (internalJSONNode *)operator_new(0x78);
  internalJSONNode(this,unparsed);
  return this;
}

Assistant:

internalJSONNode * internalJSONNode::newInternal(const json_string & unparsed) {
	#ifdef JSON_MEMORY_POOL /*-> JSON_MEMORY_POOL */
		return new((internalJSONNode*)json_internal_mempool.allocate()) internalJSONNode(unparsed);
	#elif defined(JSON_MEMORY_CALLBACKS) /*<- else JSON_MEMORY_CALLBACKS */
		return new(json_malloc<internalJSONNode>(1)) internalJSONNode(unparsed);
	#else /*<- else */
		return new internalJSONNode(unparsed);
	#endif /*<- */
}